

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_flac__seek_forward_by_pcm_frames(ma_dr_flac *pFlac,ma_uint64 pcmFramesToSeek)

{
  uint uVar1;
  ma_uint32 mVar2;
  ma_bool32 mVar3;
  ulong uVar4;
  ulong uVar5;
  ma_uint64 mVar6;
  bool bVar7;
  
  if (pcmFramesToSeek == 0) {
    mVar6 = 0;
  }
  else {
    mVar6 = 0;
    do {
      uVar1 = (pFlac->currentFLACFrame).pcmFramesRemaining;
      uVar4 = (ulong)uVar1;
      if (uVar4 == 0) {
        mVar3 = ma_dr_flac__read_and_decode_next_flac_frame(pFlac);
        if (mVar3 == 0) break;
      }
      else {
        bVar7 = uVar4 <= pcmFramesToSeek;
        uVar5 = pcmFramesToSeek - uVar4;
        mVar2 = 0;
        if (!bVar7) {
          uVar4 = pcmFramesToSeek;
          mVar2 = uVar1 - (int)pcmFramesToSeek;
        }
        pcmFramesToSeek = 0;
        if (bVar7) {
          pcmFramesToSeek = uVar5;
        }
        mVar6 = mVar6 + uVar4;
        (pFlac->currentFLACFrame).pcmFramesRemaining = mVar2;
      }
    } while (pcmFramesToSeek != 0);
  }
  pFlac->currentPCMFrame = pFlac->currentPCMFrame + mVar6;
  return mVar6;
}

Assistant:

static ma_uint64 ma_dr_flac__seek_forward_by_pcm_frames(ma_dr_flac* pFlac, ma_uint64 pcmFramesToSeek)
{
    ma_uint64 pcmFramesRead = 0;
    while (pcmFramesToSeek > 0) {
        if (pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_and_decode_next_flac_frame(pFlac)) {
                break;
            }
        } else {
            if (pFlac->currentFLACFrame.pcmFramesRemaining > pcmFramesToSeek) {
                pcmFramesRead   += pcmFramesToSeek;
                pFlac->currentFLACFrame.pcmFramesRemaining -= (ma_uint32)pcmFramesToSeek;
                pcmFramesToSeek  = 0;
            } else {
                pcmFramesRead   += pFlac->currentFLACFrame.pcmFramesRemaining;
                pcmFramesToSeek -= pFlac->currentFLACFrame.pcmFramesRemaining;
                pFlac->currentFLACFrame.pcmFramesRemaining = 0;
            }
        }
    }
    pFlac->currentPCMFrame += pcmFramesRead;
    return pcmFramesRead;
}